

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  string *psVar1;
  Descriptor *pDVar2;
  MethodOptions *pMVar3;
  MethodOptions *pMVar4;
  MethodDescriptorProto *proto_local;
  MethodDescriptor *this_local;
  
  psVar1 = name_abi_cxx11_(this);
  MethodDescriptorProto::set_name(proto,psVar1);
  pDVar2 = input_type(this);
  if (((byte)pDVar2[0x29] & 1) == 0) {
    MethodDescriptorProto::set_input_type(proto,".");
  }
  psVar1 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(proto);
  pDVar2 = input_type(this);
  Descriptor::full_name_abi_cxx11_(pDVar2);
  std::__cxx11::string::append((string *)psVar1);
  pDVar2 = output_type(this);
  if (((byte)pDVar2[0x29] & 1) == 0) {
    MethodDescriptorProto::set_output_type(proto,".");
  }
  psVar1 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(proto);
  pDVar2 = output_type(this);
  Descriptor::full_name_abi_cxx11_(pDVar2);
  std::__cxx11::string::append((string *)psVar1);
  pMVar3 = options(this);
  pMVar4 = MethodOptions::default_instance();
  if (pMVar3 != pMVar4) {
    pMVar3 = MethodDescriptorProto::mutable_options(proto);
    pMVar4 = options(this);
    MethodOptions::CopyFrom(pMVar3,pMVar4);
  }
  if (((byte)this[0x60] & 1) != 0) {
    MethodDescriptorProto::set_client_streaming(proto,true);
  }
  if (((byte)this[0x61] & 1) != 0) {
    MethodDescriptorProto::set_server_streaming(proto,true);
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}